

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentence_test.cpp
# Opt level: O2

void __thiscall
jhu::thrax::SentenceTests_ManyTokens_Test::~SentenceTests_ManyTokens_Test
          (SentenceTests_ManyTokens_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SentenceTests, ManyTokens) {
  std::string_view line = "  foo bar  baz    ";
  auto s = tokens<false>(line);
  ASSERT_EQ(3, s.size());
  EXPECT_EQ("foo", s[0]);
  EXPECT_EQ("bar", s[1]);
  EXPECT_EQ("baz", s[2]);
}